

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void opj_image_destroy(opj_image_t *image)

{
  opj_image_comp_t *image_comp;
  OPJ_UINT32 compno;
  opj_image_t *image_local;
  
  if (image != (opj_image_t *)0x0) {
    if (image->comps != (opj_image_comp_t *)0x0) {
      for (image_comp._4_4_ = 0; image_comp._4_4_ < image->numcomps;
          image_comp._4_4_ = image_comp._4_4_ + 1) {
        if (image->comps[image_comp._4_4_].data != (OPJ_INT32 *)0x0) {
          opj_image_data_free(image->comps[image_comp._4_4_].data);
        }
      }
      opj_free(image->comps);
    }
    if (image->icc_profile_buf != (OPJ_BYTE *)0x0) {
      opj_free(image->icc_profile_buf);
    }
    opj_free(image);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_image_destroy(opj_image_t *image)
{
    if (image) {
        if (image->comps) {
            OPJ_UINT32 compno;

            /* image components */
            for (compno = 0; compno < image->numcomps; compno++) {
                opj_image_comp_t *image_comp = &(image->comps[compno]);
                if (image_comp->data) {
                    opj_image_data_free(image_comp->data);
                }
            }
            opj_free(image->comps);
        }

        if (image->icc_profile_buf) {
            opj_free(image->icc_profile_buf);
        }

        opj_free(image);
    }
}